

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O1

void __thiscall QFont::QFont(QFont *this,QString *family,int pointSize,int weight,bool italic)

{
  QArrayData *pQVar1;
  double dVar2;
  Data *pDVar3;
  QString *pQVar4;
  qsizetype qVar5;
  CutResult CVar6;
  QFontPrivate *pQVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long in_FS_OFFSET;
  QStringView QVar13;
  undefined1 auVar14 [16];
  QStringList familyList;
  QArrayDataPointer<QString> local_98;
  QString local_78;
  long local_60;
  QArrayDataPointer<QString> local_58;
  long local_38;
  long originalLength;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = (QFontPrivate *)operator_new(0x98);
  QFontPrivate::QFontPrivate(pQVar7);
  (this->d).d.ptr = pQVar7;
  LOCK();
  (pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int> + 1);
  UNLOCK();
  this->resolve_mask = 0x20000;
  if (pointSize < 1) {
    dVar2 = 12.0;
  }
  else {
    this->resolve_mask = 0x20002;
    dVar2 = (double)pointSize;
  }
  if (weight < 0) {
    uVar11 = 0x1900000000000;
  }
  else {
    *(byte *)&this->resolve_mask = (byte)this->resolve_mask | 0x30;
    uVar11 = (ulong)(weight & 0x3ff) << 0x28;
  }
  if (italic) {
    *(byte *)&this->resolve_mask = (byte)this->resolve_mask | 0x20;
    uVar8 = 0x10000000;
  }
  else {
    uVar8 = 0;
  }
  local_98.d = (Data *)0x0;
  local_98.ptr = (QString *)0x0;
  local_98.size = 0;
  pQVar1 = (QArrayData *)(family->d).size;
  if (pQVar1 != (QArrayData *)0x0) {
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.ptr = (family->d).ptr;
    local_78.d.d = (Data *)pQVar1;
    QStringView::split(&local_58,&local_78,0x2c,0,1);
    uVar9 = (uint)local_58.size;
    QList<QString>::reserve((QList<QString> *)&local_98,(long)(int)uVar9);
    if (0 < (int)uVar9) {
      uVar10 = (ulong)(uVar9 & 0x7fffffff);
      lVar12 = 8;
      do {
        QVar13.m_data = *(storage_type_conflict **)((long)&((local_58.ptr)->d).d + lVar12);
        QVar13.m_size = *(qsizetype *)((long)local_58.ptr + lVar12 + -8);
        auVar14 = QtPrivate::trimmed(QVar13);
        auVar14._8_8_ = auVar14._8_8_;
        originalLength = auVar14._0_8_;
        if (originalLength != 0) {
          if (*auVar14._8_8_ == 0x27) {
            if (auVar14._8_8_[originalLength + -1] == 0x27) goto LAB_00489619;
          }
          else if ((*auVar14._8_8_ == 0x22) && (auVar14._8_8_[originalLength + -1] == 0x22)) {
LAB_00489619:
            local_60 = originalLength + -2;
            local_78.d.d = (Data *)0x1;
            CVar6 = QtPrivate::QContainerImplHelper::mid
                              (originalLength,(qsizetype *)&local_78,&local_60);
            if (CVar6 == Null) {
              auVar14 = ZEXT816(0);
            }
            else {
              auVar14._8_8_ = auVar14._8_8_ + (long)local_78.d.d;
              auVar14._0_8_ = local_60;
            }
          }
        }
        QString::QString(&local_78,auVar14._8_8_,auVar14._0_8_);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_98,local_98.size,&local_78);
        QList<QString>::end((QList<QString> *)&local_98);
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
        lVar12 = lVar12 + 0x10;
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
    if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d)->super_QArrayData,0x10,0x10);
      }
    }
  }
  qVar5 = local_98.size;
  pQVar4 = local_98.ptr;
  pDVar3 = local_98.d;
  pQVar7 = (this->d).d.ptr;
  local_98.d = (Data *)0x0;
  local_98.ptr = (QString *)0x0;
  local_98.size = 0;
  local_58.d = (pQVar7->request).families.d.d;
  local_58.ptr = (pQVar7->request).families.d.ptr;
  (pQVar7->request).families.d.d = pDVar3;
  (pQVar7->request).families.d.ptr = pQVar4;
  local_58.size = (pQVar7->request).families.d.size;
  (pQVar7->request).families.d.size = qVar5;
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
  pQVar7 = (this->d).d.ptr;
  (pQVar7->request).pointSize = dVar2;
  (pQVar7->request).pixelSize = -1.0;
  *(ulong *)&(pQVar7->request).field_0x60 =
       *(ulong *)&(pQVar7->request).field_0x60 & 0xfffc00ffffffffff | uVar11;
  pQVar7 = (this->d).d.ptr;
  *(ulong *)&(pQVar7->request).field_0x60 =
       *(ulong *)&(pQVar7->request).field_0x60 & 0xffffffffcfffffff | uVar8;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QFont::QFont(const QString &family, int pointSize, int weight, bool italic)
    : d(new QFontPrivate()), resolve_mask(QFont::FamiliesResolved)
{
    if (pointSize <= 0) {
        pointSize = 12;
    } else {
        resolve_mask |= QFont::SizeResolved;
    }

    if (weight < 0) {
        weight = Normal;
    } else {
        resolve_mask |= QFont::WeightResolved | QFont::StyleResolved;
    }

    if (italic)
        resolve_mask |= QFont::StyleResolved;

    d->request.families = splitIntoFamilies(family);
    d->request.pointSize = qreal(pointSize);
    d->request.pixelSize = -1;
    d->request.weight = weight;
    d->request.style = italic ? QFont::StyleItalic : QFont::StyleNormal;
}